

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O2

bool __thiscall
ONX_Model::ValdateComponentIdAndName
          (ONX_Model *this,Type component_type,ON_UUID *candidate_id,ON_UUID *component_parent_id,
          wchar_t *candidate_name,bool bResolveIdConflict,bool bResolveNameConflict,
          ON_UUID *model_id,ON_wString *model_name)

{
  uchar auVar1 [8];
  wchar_t *candidate_name_00;
  ON_UUID *pOVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  wchar_t *suffix_separator;
  char *sFormat;
  ON_UUID *pOVar6;
  int line_number;
  ON_ComponentManifest *this_00;
  ON_UUID OVar7;
  ON_wString name;
  ON_NameHash name_hash;
  ON_UUID name_parent_id;
  undefined4 in_stack_ffffffffffffff2c;
  byte local_b9;
  ON_wString local_b8;
  ON_UUID *local_b0;
  ON_UUID *local_a8;
  ON_NameHash local_a0;
  ON_NameHash local_78;
  ON_UUID local_48;
  
  local_b0 = candidate_id;
  bVar3 = ON_ModelComponent::ComponentTypeIsValid(component_type);
  if (bVar3) {
    local_a8 = component_parent_id;
    bVar3 = ON_ModelComponent::IndexRequired(component_type);
    this_00 = &this->m_manifest;
    uVar5 = ON_ComponentManifest::ComponentIndexLimit(this_00,component_type);
    pOVar2 = local_b0;
    if ((!bVar3) || (uVar5 < 0x7fffffff)) {
      bVar3 = ON_ComponentManifest::IdIsAvailable(this_00,*local_b0);
      bVar4 = ON_UuidIsNil(pOVar2);
      local_b9 = 1;
      if (!bVar4) {
        if (!bVar3 && !bResolveIdConflict) goto LAB_00482142;
        local_b9 = ~bVar3 & bResolveIdConflict;
      }
      ON_wString::ON_wString(&local_b8,candidate_name);
      ON_wString::TrimLeftAndRight(&local_b8,(wchar_t *)0x0);
      bVar3 = ON_ModelComponent::UniqueNameRequired(component_type);
      pOVar2 = local_a8;
      if (!bVar3) goto LAB_00482347;
      bVar3 = ON_ModelComponent::UniqueNameIncludesParent(component_type);
      pOVar6 = pOVar2;
      if (!bVar3) {
        pOVar6 = &ON_nil_uuid;
      }
      local_48.Data1 = pOVar6->Data1;
      local_48.Data2 = pOVar6->Data2;
      local_48.Data3 = pOVar6->Data3;
      local_48.Data4 = *&pOVar6->Data4;
      ON_NameHash::Create(&local_78,&local_48,&local_b8);
      bVar3 = ON_NameHash::IsInvalidNameHash(&local_78);
      if (bVar3) {
        if (bResolveNameConflict) {
          ON_wString::operator=(&local_b8,&ON_wString::EmptyString);
          ON_NameHash::Create(&local_a0,&local_48,&local_b8);
          local_78.m_parent_id.Data4[0] = local_a0.m_parent_id.Data4[0];
          local_78.m_parent_id.Data4[1] = local_a0.m_parent_id.Data4[1];
          local_78.m_parent_id.Data4[2] = local_a0.m_parent_id.Data4[2];
          local_78.m_parent_id.Data4[3] = local_a0.m_parent_id.Data4[3];
          local_78.m_parent_id.Data4[4] = local_a0.m_parent_id.Data4[4];
          local_78.m_parent_id.Data4[5] = local_a0.m_parent_id.Data4[5];
          local_78.m_parent_id.Data4[6] = local_a0.m_parent_id.Data4[6];
          local_78.m_parent_id.Data4[7] = local_a0.m_parent_id.Data4[7];
          local_78.m_sha1_hash.m_digest[0xc] = local_a0.m_sha1_hash.m_digest[0xc];
          local_78.m_sha1_hash.m_digest[0xd] = local_a0.m_sha1_hash.m_digest[0xd];
          local_78.m_sha1_hash.m_digest[0xe] = local_a0.m_sha1_hash.m_digest[0xe];
          local_78.m_sha1_hash.m_digest[0xf] = local_a0.m_sha1_hash.m_digest[0xf];
          local_78.m_sha1_hash.m_digest[0x10] = local_a0.m_sha1_hash.m_digest[0x10];
          local_78.m_sha1_hash.m_digest[0x11] = local_a0.m_sha1_hash.m_digest[0x11];
          local_78.m_sha1_hash.m_digest[0x12] = local_a0.m_sha1_hash.m_digest[0x12];
          local_78.m_sha1_hash.m_digest[0x13] = local_a0.m_sha1_hash.m_digest[0x13];
          local_78.m_parent_id.Data1 = local_a0.m_parent_id.Data1;
          local_78.m_parent_id.Data2 = local_a0.m_parent_id.Data2;
          local_78.m_parent_id.Data3 = local_a0.m_parent_id.Data3;
          local_78.m_flags = local_a0.m_flags;
          local_78.m_sha1_hash.m_digest[0] = local_a0.m_sha1_hash.m_digest[0];
          local_78.m_sha1_hash.m_digest[1] = local_a0.m_sha1_hash.m_digest[1];
          local_78.m_sha1_hash.m_digest[2] = local_a0.m_sha1_hash.m_digest[2];
          local_78.m_sha1_hash.m_digest[3] = local_a0.m_sha1_hash.m_digest[3];
          local_78.m_sha1_hash.m_digest[4] = local_a0.m_sha1_hash.m_digest[4];
          local_78.m_sha1_hash.m_digest[5] = local_a0.m_sha1_hash.m_digest[5];
          local_78.m_sha1_hash.m_digest[6] = local_a0.m_sha1_hash.m_digest[6];
          local_78.m_sha1_hash.m_digest[7] = local_a0.m_sha1_hash.m_digest[7];
          local_78.m_sha1_hash.m_digest[8] = local_a0.m_sha1_hash.m_digest[8];
          local_78.m_sha1_hash.m_digest[9] = local_a0.m_sha1_hash.m_digest[9];
          local_78.m_sha1_hash.m_digest[10] = local_a0.m_sha1_hash.m_digest[10];
          local_78.m_sha1_hash.m_digest[0xb] = local_a0.m_sha1_hash.m_digest[0xb];
          goto LAB_00482284;
        }
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                   ,0x26f,"","Invalid candidate_name parameter.");
      }
      else {
LAB_00482284:
        bVar3 = ON_wString::IsNotEmpty(&local_b8);
        if (bVar3) {
          bVar3 = ON_ComponentManifest::NameIsAvailable(this_00,component_type,&local_78);
          if (bResolveNameConflict && !bVar3) {
LAB_004822bd:
            auVar1 = *(uchar (*) [8])pOVar2;
            candidate_name_00 = *(wchar_t **)pOVar2->Data4;
            suffix_separator = ON_wString::operator_cast_to_wchar_t_(&local_b8);
            OVar7._1_7_ = 0;
            OVar7.Data1._0_1_ = component_type;
            OVar7.Data4 = auVar1;
            ON_ComponentManifest::UnusedName
                      ((ON_ComponentManifest *)&local_a0,(Type)this_00,OVar7,candidate_name_00,
                       (wchar_t *)0x0,suffix_separator,0,
                       (uint *)CONCAT44(in_stack_ffffffffffffff2c,0xffffffff));
            ON_wString::operator=(&local_b8,(ON_wString *)&local_a0);
            ON_wString::~ON_wString((ON_wString *)&local_a0);
            bVar3 = ON_wString::IsEmpty(&local_b8);
            if (!bVar3) {
LAB_00482347:
              if (local_b9 == 0) {
                OVar7 = *local_b0;
              }
              else {
                OVar7 = ON_CreateId();
              }
              *model_id = OVar7;
              ON_wString::operator=(model_name,&local_b8);
              ON_wString::~ON_wString(&local_b8);
              return true;
            }
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                       ,0x283,"","Unable to create component name.");
          }
          else if (bVar3) goto LAB_00482347;
        }
        else if (bResolveNameConflict) goto LAB_004822bd;
      }
      ON_wString::~ON_wString(&local_b8);
      goto LAB_00482142;
    }
    sFormat = "Unable to create model component index.";
    line_number = 0x256;
  }
  else {
    sFormat = "Invalid component_type parameter.";
    line_number = 0x24e;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
             ,line_number,"",sFormat);
LAB_00482142:
  model_id->Data1 = 0;
  model_id->Data2 = 0;
  model_id->Data3 = 0;
  model_id->Data4[0] = '\0';
  model_id->Data4[1] = '\0';
  model_id->Data4[2] = '\0';
  model_id->Data4[3] = '\0';
  model_id->Data4[4] = '\0';
  model_id->Data4[5] = '\0';
  model_id->Data4[6] = '\0';
  model_id->Data4[7] = '\0';
  ON_wString::operator=(model_name,&ON_wString::EmptyString);
  return false;
}

Assistant:

bool ONX_Model::ValdateComponentIdAndName(
  ON_ModelComponent::Type component_type,
  const ON_UUID& candidate_id,
  const ON_UUID& component_parent_id,
  const wchar_t* candidate_name,
  bool bResolveIdConflict,
  bool bResolveNameConflict,
  ON_UUID& model_id,
  ON_wString& model_name
  ) const
{
  for (;;)
  {
    if (false == ON_ModelComponent::ComponentTypeIsValid(component_type))
    {
      ON_ERROR("Invalid component_type parameter.");
      break;
    }

    const bool bIndexRequired = ON_ModelComponent::IndexRequired(component_type);
    const unsigned int count = m_manifest.ComponentIndexLimit(component_type);
    if (bIndexRequired && count >= 0x7FFFFFFFU)
    {
      ON_ERROR("Unable to create model component index.");
      break;
    }
    
    const bool bIdAvailable = m_manifest.IdIsAvailable(candidate_id);
    const bool bCreateId = ON_UuidIsNil(candidate_id) || (false == bIdAvailable && bResolveIdConflict);
    if (false == bIdAvailable && false == bCreateId)
    {
      break;
    }

    ON_wString name(candidate_name);
    name.TrimLeftAndRight();
    const bool bUniqueNameReqired = ON_ModelComponent::UniqueNameRequired(component_type);
    if ( bUniqueNameReqired )
    {
      const ON_UUID name_parent_id
        = ON_ModelComponent::UniqueNameIncludesParent(component_type)
        ? component_parent_id
        : ON_nil_uuid;
      ON_NameHash name_hash = ON_NameHash::Create(name_parent_id, name);
      if (name_hash.IsInvalidNameHash())
      {
        if (false == bResolveNameConflict)
        {
          ON_ERROR("Invalid candidate_name parameter.");
          break;
        }
        name = ON_wString::EmptyString;
        name_hash = ON_NameHash::Create(name_parent_id, name);
      }

      const bool bNameIsValid = name.IsNotEmpty() && m_manifest.NameIsAvailable(component_type, name_hash);
      if (false == bNameIsValid )
      {
        // we need to create a unique and non-empty name
        if (false == bResolveNameConflict)
        {
          // not allowed to modify name
          break;
        }

        name = m_manifest.UnusedName(component_type, component_parent_id, nullptr, name, nullptr, ON_UNSET_UINT_INDEX, nullptr);
        if (name.IsEmpty())
        {
          ON_ERROR("Unable to create component name.");
          break;
        }
      }
    }

    model_id = bCreateId ? ON_CreateId() : candidate_id;
    model_name = name;
    return true;
  }

  model_id = ON_nil_uuid;
  model_name = ON_wString::EmptyString;
  return false;
}